

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADAU1462_IC_1.h
# Opt level: O3

void default_download_IC_1(void)

{
  uint3 uVar1;
  int iVar2;
  undefined1 uVar3;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 *puStack_48;
  undefined8 uStack_40;
  undefined4 uStack_38;
  uint32_t uStack_34;
  uint16_t uStack_30;
  uint8_t uStack_2e;
  undefined4 uStack_2d;
  undefined1 uStack_29;
  uint8_t *puStack_28;
  undefined8 uStack_20;
  undefined4 uStack_18;
  uint32_t uStack_14;
  undefined8 uStack_10;
  
  uStack_10 = 0x1012bb;
  spi_write(0xf890,2,"");
  uStack_10 = 0x1012ce;
  spi_write(0xf890,2,"");
  uStack_10 = 0x1012d8;
  usleep(20000);
  uStack_10 = 0x1012eb;
  spi_write(0xf400,2,"");
  uStack_10 = 0x1012fe;
  spi_write(0xf400,2,"");
  uStack_10 = 0x101308;
  usleep(20000);
  uStack_10 = 0x10131b;
  spi_write(0xf403,2,"");
  uStack_10 = 0x10132e;
  spi_write(0xf403,2,"");
  uStack_10 = 0x101341;
  spi_write(0xf003,2,"");
  uStack_10 = 0x101354;
  spi_write(0xf001,2,"");
  uStack_10 = 0x101367;
  spi_write(0xf002,2,"");
  uStack_10 = 0x10137a;
  spi_write(0xf005,2,"");
  uStack_10 = 0x10138d;
  spi_write(0xf003,2,"");
  uStack_10 = 0x101397;
  usleep(20000);
  uStack_10 = 0x1013aa;
  spi_write(0xf050,2,R14_POWER_ENABLE0_IC_1_Default);
  uStack_10 = 0x1013bd;
  spi_write(0xf051,2,"");
  uStack_10 = 0x1013d0;
  spi_write(0xf180,2,"");
  uStack_10 = 0x1013e3;
  spi_write(0xf181,2,"");
  uStack_10 = 0x1013f6;
  spi_write(0xf182,2,"");
  uStack_10 = 0x101409;
  spi_write(0xf183,2,"");
  uStack_10 = 0x10141c;
  spi_write(0xf184,2,"");
  uStack_10 = 0x10142f;
  spi_write(0xf185,2,"");
  uStack_10 = 0x101442;
  spi_write(0xf186,2,"");
  uStack_10 = 0x101455;
  spi_write(0xf187,2,"");
  uStack_10 = 0x101468;
  spi_write(0xf188,2,"");
  uStack_10 = 0x10147b;
  spi_write(0xf189,2,"");
  uStack_10 = 0x10148e;
  spi_write(0xf18a,2,"");
  uStack_10 = 0x1014a1;
  spi_write(0xf18b,2,"");
  uStack_10 = 0x1014b4;
  spi_write(0xf18c,2,"");
  uStack_10 = 0x1014c7;
  spi_write(0xf18d,2,"");
  uStack_10 = 0x1014da;
  spi_write(0xf18e,2,"");
  uStack_10 = 0x1014ed;
  spi_write(0xf18f,2,"");
  uStack_10 = 0x101500;
  spi_write(0xf190,2,"");
  uStack_10 = 0x101513;
  spi_write(0xf191,2,"");
  uStack_10 = 0x101526;
  spi_write(0xf192,2,"");
  uStack_10 = 0x101539;
  spi_write(0xf193,2,"");
  uStack_10 = 0x10154c;
  spi_write(0xf194,2,"");
  uStack_10 = 0x10155f;
  spi_write(0xf195,2,"");
  uStack_10 = 0x101572;
  spi_write(0xf196,2,"");
  uStack_10 = 0x101585;
  spi_write(0xf197,2,"");
  uStack_10 = 0x101598;
  spi_write(0xf201,2,"");
  uStack_10 = 0x1015ab;
  spi_write(0xf205,2,"");
  uStack_10 = 0x1015be;
  spi_write(0xf209,2,"");
  uStack_10 = 0x1015d1;
  spi_write(0xf20d,2,"");
  uStack_10 = 0x1015e4;
  spi_write(0xf210,2,R44_SERIAL_BYTE_4_0_IC_1_Default);
  uStack_10 = 0x1015f7;
  spi_write(0xf214,2,R45_SERIAL_BYTE_5_0_IC_1_Default);
  uStack_10 = 0x10160a;
  spi_write(0xf218,2,R46_SERIAL_BYTE_6_0_IC_1_Default);
  uStack_10 = 0x10161d;
  spi_write(0xf21c,2,R47_SERIAL_BYTE_7_0_IC_1_Default);
  uStack_10 = 0x101630;
  spi_write(0xc000,0x234,"");
  uStack_10 = 0x101640;
  spi_write(0,0x94,"");
  uStack_10 = 0x101653;
  spi_write(0x6000,0x60,"");
  uStack_10 = 0x101666;
  spi_write(0xf403,2,"");
  uStack_10 = 0x101679;
  spi_write(0xf404,2,"");
  uStack_10 = 0x10168c;
  spi_write(0xf401,2,"");
  uStack_10 = 0x10169f;
  spi_write(0xf402,2,"");
  uStack_10 = 0x1016b2;
  spi_write(0xf402,2,"");
  uStack_10 = 0x1016bc;
  usleep(20000);
  uStack_40 = 0;
  uStack_34 = speed;
  uStack_30 = delay;
  uStack_2e = bits;
  uStack_2d = 0;
  uStack_29 = 0;
  puStack_28 = "";
  uStack_18 = 2;
  uStack_14 = speed;
  uStack_10._0_3_ = CONCAT12(bits,delay);
  uVar1 = (uint3)uStack_10;
  uStack_10 = (ulong)(uint3)uStack_10;
  puStack_48 = &uStack_4b;
  uStack_4b = 0;
  uStack_4a = 0xf4;
  uStack_49 = 0;
  uStack_38 = 3;
  uVar3 = 4;
  if (((mode >> 9 & 1) != 0) || (uVar3 = 2, (mode >> 8 & 1) != 0)) {
    uStack_10._0_5_ = CONCAT14(uVar3,(uint)uVar1);
    uStack_10 = (ulong)(uint5)uStack_10;
  }
  uVar3 = 4;
  if (((mode >> 0xb & 1) != 0) || (uVar3 = 2, (mode >> 10 & 1) != 0)) {
    uStack_10 = (ulong)CONCAT15(uVar3,(uint5)uStack_10);
  }
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    puStack_28 = (uint8_t *)0x0;
  }
  uStack_20 = 0;
  iVar2 = ioctl(i2s_fd,0x40406b00,&puStack_48);
  if (iVar2 < 1) {
    spi_write_cold_1();
    return;
  }
  return;
}

Assistant:

void default_download_IC_1() {
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOFT_RESET_IC_1_ADDR, REG_SOFT_RESET_IC_1_BYTE, R0_SOFT_RESET_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOFT_RESET_IC_1_ADDR, REG_SOFT_RESET_IC_1_BYTE, R1_SOFT_RESET_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R2_RESET_DELAY_IC_1_SIZE, R2_RESET_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R3_HIBERNATE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R4_HIBERNATE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R5_HIBERNATE_DELAY_IC_1_SIZE, R5_HIBERNATE_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R6_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R7_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_ENABLE_IC_1_ADDR, REG_PLL_ENABLE_IC_1_BYTE, R8_PLL_ENABLE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_CTRL1_IC_1_ADDR, REG_PLL_CTRL1_IC_1_BYTE, R9_PLL_CTRL1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_CLK_SRC_IC_1_ADDR, REG_PLL_CLK_SRC_IC_1_BYTE, R10_PLL_CLK_SRC_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_MCLK_OUT_IC_1_ADDR, REG_MCLK_OUT_IC_1_BYTE, R11_MCLK_OUT_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_ENABLE_IC_1_ADDR, REG_PLL_ENABLE_IC_1_BYTE, R12_PLL_ENABLE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R13_PLL_LOCK_DELAY_IC_1_SIZE, R13_PLL_LOCK_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_POWER_ENABLE0_IC_1_ADDR, REG_POWER_ENABLE0_IC_1_BYTE, R14_POWER_ENABLE0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_POWER_ENABLE1_IC_1_ADDR, REG_POWER_ENABLE1_IC_1_BYTE, R15_POWER_ENABLE1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE0_IC_1_ADDR, REG_SOUT_SOURCE0_IC_1_BYTE, R16_SOUT_SOURCE0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE1_IC_1_ADDR, REG_SOUT_SOURCE1_IC_1_BYTE, R17_SOUT_SOURCE1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE2_IC_1_ADDR, REG_SOUT_SOURCE2_IC_1_BYTE, R18_SOUT_SOURCE2_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE3_IC_1_ADDR, REG_SOUT_SOURCE3_IC_1_BYTE, R19_SOUT_SOURCE3_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE4_IC_1_ADDR, REG_SOUT_SOURCE4_IC_1_BYTE, R20_SOUT_SOURCE4_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE5_IC_1_ADDR, REG_SOUT_SOURCE5_IC_1_BYTE, R21_SOUT_SOURCE5_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE6_IC_1_ADDR, REG_SOUT_SOURCE6_IC_1_BYTE, R22_SOUT_SOURCE6_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE7_IC_1_ADDR, REG_SOUT_SOURCE7_IC_1_BYTE, R23_SOUT_SOURCE7_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE8_IC_1_ADDR, REG_SOUT_SOURCE8_IC_1_BYTE, R24_SOUT_SOURCE8_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE9_IC_1_ADDR, REG_SOUT_SOURCE9_IC_1_BYTE, R25_SOUT_SOURCE9_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE10_IC_1_ADDR, REG_SOUT_SOURCE10_IC_1_BYTE, R26_SOUT_SOURCE10_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE11_IC_1_ADDR, REG_SOUT_SOURCE11_IC_1_BYTE, R27_SOUT_SOURCE11_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE12_IC_1_ADDR, REG_SOUT_SOURCE12_IC_1_BYTE, R28_SOUT_SOURCE12_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE13_IC_1_ADDR, REG_SOUT_SOURCE13_IC_1_BYTE, R29_SOUT_SOURCE13_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE14_IC_1_ADDR, REG_SOUT_SOURCE14_IC_1_BYTE, R30_SOUT_SOURCE14_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE15_IC_1_ADDR, REG_SOUT_SOURCE15_IC_1_BYTE, R31_SOUT_SOURCE15_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE16_IC_1_ADDR, REG_SOUT_SOURCE16_IC_1_BYTE, R32_SOUT_SOURCE16_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE17_IC_1_ADDR, REG_SOUT_SOURCE17_IC_1_BYTE, R33_SOUT_SOURCE17_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE18_IC_1_ADDR, REG_SOUT_SOURCE18_IC_1_BYTE, R34_SOUT_SOURCE18_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE19_IC_1_ADDR, REG_SOUT_SOURCE19_IC_1_BYTE, R35_SOUT_SOURCE19_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE20_IC_1_ADDR, REG_SOUT_SOURCE20_IC_1_BYTE, R36_SOUT_SOURCE20_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE21_IC_1_ADDR, REG_SOUT_SOURCE21_IC_1_BYTE, R37_SOUT_SOURCE21_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE22_IC_1_ADDR, REG_SOUT_SOURCE22_IC_1_BYTE, R38_SOUT_SOURCE22_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE23_IC_1_ADDR, REG_SOUT_SOURCE23_IC_1_BYTE, R39_SOUT_SOURCE23_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_0_1_IC_1_ADDR, REG_SERIAL_BYTE_0_1_IC_1_BYTE, R40_SERIAL_BYTE_0_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_1_1_IC_1_ADDR, REG_SERIAL_BYTE_1_1_IC_1_BYTE, R41_SERIAL_BYTE_1_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_2_1_IC_1_ADDR, REG_SERIAL_BYTE_2_1_IC_1_BYTE, R42_SERIAL_BYTE_2_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_3_1_IC_1_ADDR, REG_SERIAL_BYTE_3_1_IC_1_BYTE, R43_SERIAL_BYTE_3_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_4_0_IC_1_ADDR, REG_SERIAL_BYTE_4_0_IC_1_BYTE, R44_SERIAL_BYTE_4_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_5_0_IC_1_ADDR, REG_SERIAL_BYTE_5_0_IC_1_BYTE, R45_SERIAL_BYTE_5_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_6_0_IC_1_ADDR, REG_SERIAL_BYTE_6_0_IC_1_BYTE, R46_SERIAL_BYTE_6_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_7_0_IC_1_ADDR, REG_SERIAL_BYTE_7_0_IC_1_BYTE, R47_SERIAL_BYTE_7_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, PROGRAM_ADDR_IC_1, PROGRAM_SIZE_IC_1, Program_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, PARAM_ADDR_IC_1, PARAM_SIZE_IC_1, Param_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, DM1_DATA_ADDR_IC_1, DM1_DATA_SIZE_IC_1, DM1_DATA_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R51_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_ADDRESS_IC_1_ADDR, REG_START_ADDRESS_IC_1_BYTE, R52_START_ADDRESS_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_PULSE_IC_1_ADDR, REG_START_PULSE_IC_1_BYTE, R53_START_PULSE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_CORE_IC_1_ADDR, REG_START_CORE_IC_1_BYTE, R54_START_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_CORE_IC_1_ADDR, REG_START_CORE_IC_1_BYTE, R55_START_CORE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R56_START_DELAY_IC_1_SIZE, R56_START_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R57_HIBERNATE_IC_1_Default );
}